

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.cpp
# Opt level: O0

void __thiscall CLayers::InitGameLayer(CLayers *this)

{
  int iVar1;
  CMapItemGroup *pCVar2;
  CMapItemLayerTilemap *pCVar3;
  CLayers *in_RDI;
  CMapItemLayerTilemap *pTilemap;
  CMapItemLayer *pLayer;
  int l;
  CMapItemGroup *pGroup;
  int g;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar4;
  int local_1c;
  int local_c;
  
  local_c = 0;
  do {
    iVar4 = local_c;
    iVar1 = NumGroups(in_RDI);
    if (iVar1 <= iVar4) {
      return;
    }
    pCVar2 = GetGroup((CLayers *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc
                     );
    for (local_1c = 0; local_1c < (pCVar2->super_CMapItemGroup_v1).m_NumLayers;
        local_1c = local_1c + 1) {
      pCVar3 = (CMapItemLayerTilemap *)
               GetLayer((CLayers *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc);
      if (((pCVar3->m_Layer).m_Type == 2) && ((pCVar3->m_Flags & 1U) != 0)) {
        in_RDI->m_pGameLayer = pCVar3;
        in_RDI->m_pGameGroup = pCVar2;
        (in_RDI->m_pGameGroup->super_CMapItemGroup_v1).m_OffsetX = 0;
        (in_RDI->m_pGameGroup->super_CMapItemGroup_v1).m_OffsetY = 0;
        (in_RDI->m_pGameGroup->super_CMapItemGroup_v1).m_ParallaxX = 100;
        (in_RDI->m_pGameGroup->super_CMapItemGroup_v1).m_ParallaxY = 100;
        if ((in_RDI->m_pGameGroup->super_CMapItemGroup_v1).m_Version < 2) {
          return;
        }
        in_RDI->m_pGameGroup->m_UseClipping = 0;
        in_RDI->m_pGameGroup->m_ClipX = 0;
        in_RDI->m_pGameGroup->m_ClipY = 0;
        in_RDI->m_pGameGroup->m_ClipW = 0;
        in_RDI->m_pGameGroup->m_ClipH = 0;
        return;
      }
    }
    local_c = local_c + 1;
  } while( true );
}

Assistant:

void CLayers::InitGameLayer()
{
	for(int g = 0; g < NumGroups(); g++)
	{
		CMapItemGroup *pGroup = GetGroup(g);
		for(int l = 0; l < pGroup->m_NumLayers; l++)
		{
			CMapItemLayer *pLayer = GetLayer(pGroup->m_StartLayer+l);
			if(pLayer->m_Type == LAYERTYPE_TILES)
			{
				CMapItemLayerTilemap *pTilemap = reinterpret_cast<CMapItemLayerTilemap *>(pLayer);
				if(pTilemap->m_Flags&TILESLAYERFLAG_GAME)
				{
					m_pGameLayer = pTilemap;
					m_pGameGroup = pGroup;

					// make sure the game group has standard settings
					m_pGameGroup->m_OffsetX = 0;
					m_pGameGroup->m_OffsetY = 0;
					m_pGameGroup->m_ParallaxX = 100;
					m_pGameGroup->m_ParallaxY = 100;

					if(m_pGameGroup->m_Version >= 2)
					{
						m_pGameGroup->m_UseClipping = 0;
						m_pGameGroup->m_ClipX = 0;
						m_pGameGroup->m_ClipY = 0;
						m_pGameGroup->m_ClipW = 0;
						m_pGameGroup->m_ClipH = 0;
					}

					return; // there can only be one game layer and game group
				}
			}
		}
	}
}